

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_art.hpp
# Opt level: O3

basic_node_ptr<unodb::detail::olc_node_header> __thiscall
unodb::detail::
olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
::leave_last_child(olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
                   *this,uint8_t child_to_delete,db_type *db_instance)

{
  pthread_t pVar1;
  basic_node_ptr<unodb::detail::olc_node_header> bVar2;
  long *plVar3;
  
  if (*(long *)&this->
                super_olc_inode_4_parent<std::span<const_std::byte>,_std::span<const_std::byte>_> ==
      1) {
    pVar1 = pthread_self();
    if (pVar1 == *(pthread_t *)
                  &(this->
                   super_olc_inode_4_parent<std::span<const_std::byte>,_std::span<const_std::byte>_>
                   ).field_0x10) {
      plVar3 = (long *)((this->
                        super_olc_inode_4_parent<std::span<const_std::byte>,_std::span<const_std::byte>_>
                        ).children._M_elems[child_to_delete].value._M_i.tagged_ptr &
                       0xfffffffffffffff8);
      if ((*plVar3 == 1) && (pVar1 == plVar3[2])) {
        bVar2 = basic_inode_4<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
                ::leave_last_child(&this->
                                    super_olc_inode_4_parent<std::span<const_std::byte>,_std::span<const_std::byte>_>
                                   ,child_to_delete,db_instance);
        return (basic_node_ptr<unodb::detail::olc_node_header>)bVar2.tagged_ptr;
      }
      __assert_fail("node_ptr_lock(this->children[child_to_delete].load()) .is_obsoleted_by_this_thread()"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./olc_art.hpp"
                    ,0x45f,
                    "auto unodb::detail::olc_inode_4<std::span<const std::byte>, std::span<const std::byte>>::leave_last_child(std::uint8_t, db_type &) [Key = std::span<const std::byte>, Value = std::span<const std::byte>]"
                   );
    }
  }
  __assert_fail("lock(*this).is_obsoleted_by_this_thread()",
                "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./olc_art.hpp"
                ,0x45d,
                "auto unodb::detail::olc_inode_4<std::span<const std::byte>, std::span<const std::byte>>::leave_last_child(std::uint8_t, db_type &) [Key = std::span<const std::byte>, Value = std::span<const std::byte>]"
               );
}

Assistant:

[[nodiscard]] auto leave_last_child(std::uint8_t child_to_delete,
                                      db_type& db_instance) noexcept {
    UNODB_DETAIL_ASSERT(lock(*this).is_obsoleted_by_this_thread());
    UNODB_DETAIL_ASSERT(node_ptr_lock(this->children[child_to_delete].load())
                            .is_obsoleted_by_this_thread());

    return parent_class::leave_last_child(child_to_delete, db_instance);
  }